

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::(anonymous_namespace)::ToProperty<std::__cxx11::string>
               (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *input,Property *output,string *err)

{
  pointer pSVar1;
  double t;
  bool bVar2;
  long lVar3;
  undefined8 uVar4;
  string *psVar5;
  pointer extraout_RAX;
  pointer pcVar6;
  long lVar7;
  ulong uVar8;
  Value val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  PrimVar pvar;
  Attribute attr;
  optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  aval;
  storage_union local_930;
  undefined1 *local_920;
  undefined1 local_918 [17];
  undefined7 uStack_907;
  bool bStack_900;
  storage_union local_8f8;
  pointer local_8e8;
  undefined1 local_8e0;
  undefined1 local_8d8 [24];
  bool local_8c0;
  undefined1 local_8b8 [40];
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [8];
  size_type local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  Variability local_5f0;
  bool local_5ec;
  string local_5e8;
  char local_5e7;
  undefined1 local_5e0 [24];
  storage_union local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  local_8b8._0_8_ = local_8b8 + 0x10;
  local_8b8._8_8_ = 0;
  local_8b8[0x10] = '\0';
  local_8b8[0x24] = false;
  local_890._M_p = (pointer)&local_880;
  local_888 = 0;
  local_880._M_local_buf[0] = '\0';
  local_860 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_870.dynamic = (void *)0x0;
  local_858 = false;
  local_850._0_8_ = (pointer)0x0;
  local_850[8] = 0;
  local_850._9_7_ = 0;
  local_850[0x10] = 0;
  local_850._17_8_ = 0;
  AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_818.elementSize.has_value_ = false;
  AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_818.hidden.has_value_ = false;
  AStack_818.hidden.contained = (storage_t<bool>)0x0;
  AStack_818.comment.has_value_ = false;
  AStack_818.weight.contained = (storage_t<double>)0x0;
  AStack_818.connectability.has_value_ = false;
  AStack_818.bindMaterialAs.contained._16_8_ = 0;
  AStack_818.bindMaterialAs.contained._24_8_ = 0;
  AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.bindMaterialAs.contained._8_8_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.comment.contained._8_8_ = 0;
  AStack_818.comment.contained._16_8_ = 0;
  AStack_818.comment.contained._24_8_ = 0;
  AStack_818.comment.contained._32_8_ = 0;
  AStack_818.comment.contained._40_8_ = 0;
  AStack_818.customData.has_value_ = false;
  AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.customData.contained._8_8_ = 0;
  AStack_818.customData.contained._16_8_ = 0;
  AStack_818.customData.contained._24_8_ = 0;
  AStack_818.customData.contained._32_8_ = 0;
  AStack_818.customData.contained._40_8_ = 0;
  AStack_818.weight.has_value_ = false;
  AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.connectability.contained._8_8_ = 0;
  AStack_818.connectability.contained._16_8_ = 0;
  AStack_818.connectability.contained._24_8_ = 0;
  AStack_818.outputName.has_value_ = false;
  AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.outputName.contained._8_8_ = 0;
  AStack_818.outputName.contained._16_8_ = 0;
  AStack_818.outputName.contained._24_8_ = 0;
  AStack_818.renderType.has_value_ = false;
  AStack_818.sdrMetadata.has_value_ = false;
  AStack_818.renderType.contained._16_8_ = 0;
  AStack_818.renderType.contained._24_8_ = 0;
  AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.renderType.contained._8_8_ = 0;
  AStack_818.displayName.has_value_ = false;
  AStack_818.sdrMetadata.contained._32_8_ = 0;
  AStack_818.sdrMetadata.contained._40_8_ = 0;
  AStack_818.sdrMetadata.contained._16_8_ = 0;
  AStack_818.sdrMetadata.contained._24_8_ = 0;
  AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.sdrMetadata.contained._8_8_ = 0;
  AStack_818.displayGroup.has_value_ = false;
  AStack_818.displayName.contained._16_8_ = 0;
  AStack_818.displayName.contained._24_8_ = 0;
  AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayName.contained._8_8_ = 0;
  AStack_818.bindMaterialAs.has_value_ = false;
  AStack_818.displayGroup.contained._16_8_ = 0;
  AStack_818.displayGroup.contained._24_8_ = 0;
  AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayGroup.contained._8_8_ = 0;
  local_830[0x10] = 0;
  stack0xfffffffffffff7e1 = 0;
  local_830._0_8_ = (pointer)0x0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8b8._32_4_ = Varying;
  local_600._M_allocated_capacity._0_4_ = 0x69727473;
  local_600._M_allocated_capacity._4_2_ = 0x676e;
  local_608 = 6;
  local_600._M_local_buf[6] = '\0';
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_610 = (undefined1  [8])&local_600;
  ::std::__cxx11::string::_M_assign((string *)&local_890);
  if (local_610 != (undefined1  [8])&local_600) {
    operator_delete((void *)local_610,
                    CONCAT17(local_600._M_local_buf[7],
                             CONCAT16(local_600._M_local_buf[6],
                                      CONCAT24(local_600._M_allocated_capacity._4_2_,
                                               local_600._M_allocated_capacity._0_4_))) + 1);
  }
  if (input->_blocked == true) {
    local_858 = true;
  }
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&input->_paths);
  }
  local_8e8 = (pointer)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_8f8.dynamic = (void *)0x0;
  local_8e0 = 0;
  local_8d8._0_8_ = (pointer)0x0;
  local_8d8[8] = 0;
  local_8d8._9_7_ = 0;
  local_8d8[0x10] = 0;
  stack0xfffffffffffff739 = 0;
  bVar2 = (input->_attrib).has_value_;
  local_610[0] = bVar2;
  if (bVar2 == true) {
    nonstd::optional_lite::detail::
    storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::construct_value((storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_608,(value_type *)&(input->_attrib).contained);
  }
  if (local_610[0] != '\x01') {
LAB_0033adda:
    if (local_610[0] == '\x01') {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::destruct_value((storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_608);
    }
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_8d8);
    if (local_8e8 != (pointer)0x0) {
      (**(code **)((long)local_8e8 + 0x20))(&local_8f8);
      local_8e8 = (pointer)0x0;
    }
    AttrMetas::operator=(&AStack_818,&input->_metas);
    Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
    ::std::__cxx11::string::operator=((string *)output,(string *)local_610);
    (output->_attrib)._variability = local_5f0;
    (output->_attrib)._varying_authored = local_5ec;
    ::std::__cxx11::string::operator=((string *)&(output->_attrib)._type_name,&local_5e8);
    linb::any::operator=((any *)&(output->_attrib)._var,(any *)&local_5c8);
    (output->_attrib)._var._blocked = local_5b0;
    local_8f8.dynamic =
         (output->_attrib)._var._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_8f8._8_8_ =
         *(pointer *)
          ((long)&(output->_attrib)._var._ts._samples.
                  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ._M_impl.super__Vector_impl_data + 8);
    local_8e8 = *(pointer *)
                 ((long)&(output->_attrib)._var._ts._samples.
                         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         ._M_impl.super__Vector_impl_data + 0x10);
    (output->_attrib)._var._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = local_5a8;
    *(pointer *)
     ((long)&(output->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 8) = local_5a0;
    *(pointer *)
     ((long)&(output->_attrib)._var._ts._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data + 0x10) = local_598;
    local_5a8 = (pointer)0x0;
    local_5a0 = (pointer)0x0;
    local_598 = (pointer)0x0;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&local_8f8);
    (output->_attrib)._var._ts._dirty = local_590;
    local_8f8.dynamic =
         (output->_attrib)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_8f8._8_8_ =
         (output->_attrib)._paths.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_8e8 = (output->_attrib)._paths.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    (output->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_start = local_588;
    (output->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_580;
    (output->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_578;
    local_588 = (pointer)0x0;
    local_580 = (pointer)0x0;
    local_578 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_8f8);
    AttrMetas::operator=(&(output->_attrib)._metas,&AStack_570);
    output->_listOpQual = local_368;
    output->_type = TStack_364;
    (output->_rel).type = local_360;
    Path::operator=(&(output->_rel).targetPath,&PStack_358);
    local_8f8.dynamic =
         (output->_rel).targetPathVector.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_8f8._8_8_ =
         (output->_rel).targetPathVector.
         super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_8e8 = (output->_rel).targetPathVector.
                super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    (output->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = local_288;
    (output->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = local_280;
    (output->_rel).targetPathVector.
    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_278;
    local_288 = (pointer)0x0;
    local_280 = (pointer)0x0;
    local_278 = (pointer)0x0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&local_8f8);
    (output->_rel).listOpQual = local_270;
    AttrMetas::operator=(&(output->_rel)._metas,&AStack_268);
    (output->_rel)._varying_authored = local_60;
    ::std::__cxx11::string::operator=((string *)&output->_prop_value_type_name,asStack_58);
    output->_has_custom = local_38;
    Property::~Property((Property *)local_610);
    AttrMetas::~AttrMetas(&AStack_818);
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_850);
    if (local_860 != (vtable_type *)0x0) {
      (*local_860->destroy)(&local_870);
      local_860 = (vtable_type *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_890._M_p != &local_880) {
      operator_delete(local_890._M_p,
                      CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1)
      ;
    }
    pcVar6 = local_8b8 + 0x10;
    if ((pointer)local_8b8._0_8_ != pcVar6) {
      operator_delete((void *)local_8b8._0_8_,CONCAT71(local_8b8._17_7_,local_8b8[0x10]) + 1);
      pcVar6 = extraout_RAX;
    }
    return SUB81(pcVar6,0);
  }
  if (local_5e7 == '\x01') {
    local_858 = true;
  }
  if (local_5e8 == (string)0x1) {
    pSVar1 = (pointer)(local_918 + 0x10);
    local_918[8] = 0;
    local_918._9_7_ = 0;
    local_918[0x10] = 0;
    local_918._0_8_ = pSVar1;
    if (local_5e7 == '\0') {
      ::std::__cxx11::string::_M_assign((string *)local_918);
      local_920 = linb::any::vtable_for_type<std::__cxx11::string>()::table;
      psVar5 = (string *)operator_new(0x20);
      *(string **)psVar5 = psVar5 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                (psVar5,local_918._0_8_,
                 (undefined1 *)
                 ((long)(double *)local_918._0_8_ + CONCAT71(local_918._9_7_,local_918[8])));
      local_930.dynamic = psVar5;
      linb::any::operator=((any *)&local_8f8,(any *)&local_930);
      if (local_920 != (undefined1 *)0x0) {
        (**(code **)(local_920 + 0x20))(&local_930);
        local_920 = (undefined1 *)0x0;
      }
    }
    if ((pointer)local_918._0_8_ != pSVar1) {
      operator_delete((void *)local_918._0_8_,CONCAT71(uStack_907,local_918[0x10]) + 1);
    }
  }
  if (local_610[0] != '\0') {
    if ((bool)local_5c8._0_1_ == true) {
      TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::update((TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_5e0);
    }
    if (local_5e0._8_8_ != local_5e0._0_8_) {
      if (local_610[0] == '\0') goto LAB_0033b115;
      if ((bool)local_5c8._0_1_ == true) {
        TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::update((TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_5e0);
      }
      local_918[0x10] = 0;
      uStack_907 = 0;
      bStack_900 = false;
      local_918._0_8_ = (pointer)0x0;
      local_918[8] = 0;
      local_918._9_7_ = 0;
      if (local_5e0._8_8_ != local_5e0._0_8_) {
        lVar7 = 0x10;
        uVar8 = 0;
        do {
          uVar4 = local_5e0._0_8_;
          t = *(double *)(local_5e0._0_8_ + lVar7 + -0x10);
          local_920 = linb::any::vtable_for_type<std::__cxx11::string>()::table;
          psVar5 = (string *)operator_new(0x20);
          *(string **)psVar5 = psVar5 + 0x10;
          lVar3 = *(long *)(uVar4 + lVar7 + -8);
          ::std::__cxx11::string::_M_construct<char*>
                    (psVar5,lVar3,*(long *)((long)(double *)uVar4 + lVar7) + lVar3);
          local_930.dynamic = psVar5;
          tinyusdz::value::TimeSamples::add_sample((TimeSamples *)local_918,t,(Value *)&local_930);
          if (local_920 != (undefined1 *)0x0) {
            (**(code **)(local_920 + 0x20))(&local_930);
            local_920 = (undefined1 *)0x0;
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x30;
        } while (uVar8 < (ulong)(((long)(local_5e0._8_8_ - local_5e0._0_8_) >> 4) *
                                -0x5555555555555555));
      }
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_8d8,
                  (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   *)local_918);
      stack0xfffffffffffff739 = CONCAT17(bStack_900,local_8d8._17_7_);
      ::std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)local_918);
    }
    if (local_610[0] != '\0') {
      if (local_5e8 == (string)0x0) {
        if ((bool)local_5c8._0_1_ == true) {
          TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::update((TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_5e0);
        }
        if (local_5e0._8_8_ == local_5e0._0_8_) goto LAB_0033adda;
      }
      Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_8f8);
      goto LAB_0033adda;
    }
  }
LAB_0033b115:
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x591,
                "value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::basic_string<char>>>::value() [T = tinyusdz::Animatable<std::basic_string<char>>]"
               );
}

Assistant:

bool ToProperty(const TypedAttribute<Animatable<T>> &input, Property &output, std::string *err) {

  DCOUT("ToProperty ");
  (void)err;

  Attribute attr;

  attr.variability() = Variability::Varying;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  DCOUT("has_connections" << input.has_connections());
  DCOUT("has_value " << input.has_value());
  DCOUT("is_blocked " << input.is_blocked());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    

    attr.set_connections(input.get_connections());
  }

  //DCOUT("has_default " << input.has_default());
  //DCOUT("has_timesamples " << input.has_timesamples());

  {
    primvar::PrimVar pvar;

    // Includes !authored()
    nonstd::optional<Animatable<T>> aval = input.get_value();
    if (aval) {

      if (aval.value().is_blocked()) {
        attr.set_blocked(true);
      }

      if (aval.value().has_value()) {
        T a;
        if (aval.value().get_default(&a)) {
          value::Value val(a);
          pvar.set_value(val);
        }
      }

      if (aval.value().has_timesamples()) {
        value::TimeSamples ts = ToTypelessTimeSamples(aval.value().get_timesamples());
        pvar.set_timesamples(ts);
      }

      if (aval.value().has_value() || aval.value().has_timesamples()) {
        attr.set_var(std::move(pvar));
      }

    } else {
      DCOUT("no animatable value.");
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /*custom*/ false);

  return true;
}